

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxratiotester.h
# Opt level: O2

void __thiscall
soplex::
SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setDelta(SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newDelta)

{
  type_conflict5 tVar1;
  Real a;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  Real local_30;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  local_30 = Tolerances::epsilon(local_40._M_ptr);
  tVar1 = boost::multiprecision::operator<=(newDelta,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  if (tVar1) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    a = Tolerances::epsilon(local_40._M_ptr);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&this->delta,a);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(this->delta).m_backend,&newDelta->m_backend);
  }
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         delta = this->tolerances()->epsilon();
      else
         delta = newDelta;
   }